

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O0

QVariant * __thiscall QSqlResult::boundValue(QSqlResult *this,QString *placeholder)

{
  QSqlResultPrivate *this_00;
  QList<QVariant> *in_RDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QSqlResultPrivate *d;
  QList<int> indexes;
  QString *key;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSqlResult *)0x14494b);
  local_28.d.size = -0x5555555555555556;
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  key = &local_28;
  QHash<QString,_QList<int>_>::value((QHash<QString,_QList<int>_> *)this_00,key);
  QList<int>::value((QList<int> *)in_RDX,(qsizetype)this_00,(parameter_type)((ulong)key >> 0x20));
  QList<QVariant>::value(in_RDX,(qsizetype)this_00);
  QList<int>::~QList((QList<int> *)0x1449c5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlResult::boundValue(const QString& placeholder) const
{
    Q_D(const QSqlResult);
    const QList<int> indexes = d->indexes.value(placeholder);
    return d->values.value(indexes.value(0,-1));
}